

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

RDL_pathIterator * RDL_pathIteratorNext(RDL_pathIterator *it)

{
  RDL_graph *pRVar1;
  RDL_edge *paRVar2;
  int iVar3;
  uint uVar4;
  RDL_lpStackElement *element;
  uchar *puVar5;
  uint *element_00;
  uint uVar6;
  size_t __size;
  uchar *__src;
  
  if (it->end == '\0') {
    iVar3 = RDL_stack_empty(it->stack);
    if (iVar3 != 0) {
      it->end = '\x01';
    }
    while (iVar3 = RDL_stack_empty(it->stack), iVar3 == 0) {
      element = (RDL_lpStackElement *)RDL_stack_top(it->stack);
      if (it->mode == 'a') {
        RDL_bitset_set(it->compressed_path,element->p);
      }
      uVar6 = element->p;
      if (element->r == uVar6) {
        RDL_stack_pop(it->stack);
        RDL_lpStackElement_delete(element);
        return it;
      }
      pRVar1 = it->spi->dPaths[element->r];
      paRVar2 = pRVar1->adjList[uVar6];
      if (pRVar1->degree[uVar6] < 2) {
        uVar4 = (*paRVar2)[0];
        if (it->mode == 'b') {
          puVar5 = it->compressed_path;
          uVar6 = RDL_edgeId(it->gra,uVar6,uVar4);
          RDL_bitset_set(puVar5,uVar6);
        }
        element->p = uVar4;
        element->ai_index = 0;
      }
      else {
        uVar6 = paRVar2[element->ai_index][0];
        if ((ulong)element->ai_index == 0) {
          __size = (size_t)it->compressed_number;
          puVar5 = (uchar *)malloc(__size);
          element->split_copy = puVar5;
          __src = it->compressed_path;
        }
        else {
          puVar5 = it->compressed_path;
          __src = element->split_copy;
          __size = (size_t)it->compressed_number;
        }
        memcpy(puVar5,__src,__size);
        if (it->mode == 'b') {
          puVar5 = it->compressed_path;
          uVar4 = RDL_edgeId(it->gra,element->p,uVar6);
          RDL_bitset_set(puVar5,uVar4);
        }
        element_00 = (uint *)malloc(0x18);
        uVar4 = element->r;
        *element_00 = uVar4;
        element_00[1] = uVar6;
        element_00[2] = 0;
        element_00[4] = 0;
        element_00[5] = 0;
        uVar6 = element->ai_index + 1;
        element->ai_index = uVar6;
        if (it->spi->dPaths[uVar4]->degree[element->p] <= uVar6) {
          RDL_stack_pop(it->stack);
          RDL_lpStackElement_delete(element);
        }
        RDL_stack_push(it->stack,element_00);
      }
    }
  }
  else {
    it = (RDL_pathIterator *)0x0;
    (*RDL_outputFunc)(RDL_ERROR,"You tried to next an ended iterator!\n");
  }
  return it;
}

Assistant:

static RDL_pathIterator* RDL_pathIteratorNext(RDL_pathIterator *it)
{
  unsigned vertex;
  RDL_lpStackElement *new_element, *top;

  if (it->end) {
    RDL_outputFunc(RDL_ERROR, "You tried to next an ended iterator!\n");
    return NULL;
  }

  if (RDL_stack_empty(it->stack)) {
    it->end = 1;
  }

  while (!RDL_stack_empty(it->stack)) {
    top = RDL_stack_top(it->stack);

    if(it->mode == 'a') {
      RDL_bitset_set(it->compressed_path, top->p);
    }

    if(top->r == top->p) {
      RDL_stack_pop(it->stack);
      RDL_lpStackElement_delete(top);
      break;
    }

    if(it->spi->dPaths[top->r]->degree[top->p] > 1)/*split*/
    {
      vertex = it->spi->dPaths[top->r]->adjList[top->p][top->ai_index][0];

      if (top->ai_index == 0) {
        top->split_copy = malloc(it->compressed_number * sizeof(*top->split_copy));
        /*make a copy of the path so far*/
        memcpy(top->split_copy, it->compressed_path,
            it->compressed_number * sizeof(*top->split_copy));
      }
      else /*not continuing the last path*/
      {
        /*get the path up until the split*/
        memcpy(it->compressed_path, top->split_copy,
            it->compressed_number * sizeof(*top->split_copy));
      }
      if(it->mode == 'b')
      {
        RDL_bitset_set(it->compressed_path, RDL_edgeId(it->gra,top->p,vertex));
      }

      new_element = malloc(sizeof(*new_element));
      new_element->r = top->r;
      new_element->p = vertex;
      new_element->ai_index = 0;
      new_element->split_copy = NULL;
      ++top->ai_index;
      if (top->ai_index >= it->spi->dPaths[top->r]->degree[top->p]) {
        RDL_stack_pop(it->stack);
        RDL_lpStackElement_delete(top);
      }

      RDL_stack_push(it->stack, new_element);
    }
    else/*not a split*/
    {
      vertex = it->spi->dPaths[top->r]->adjList[top->p][0][0];
      if(it->mode == 'b')
      {
        RDL_bitset_set(it->compressed_path, RDL_edgeId(it->gra,top->p,vertex));
      }
      top->p = vertex;
      top->ai_index = 0;
    }
  }

  return it;
}